

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

regexp_flag mjs::parse_regexp_flags(global_object *global,string *s)

{
  regexp_flag rVar1;
  wstring_view wVar2;
  wstring_view s_00;
  exception *e;
  string *s_local;
  global_object *global_local;
  
  wVar2 = string::view(s);
  s_00._M_str = wVar2._M_str;
  s_00._M_len = (size_t)s_00._M_str;
  rVar1 = regexp_flags_from_string((mjs *)wVar2._M_len,s_00);
  return rVar1;
}

Assistant:

regexp_flag parse_regexp_flags(global_object& global, const string& s) {
    try {
        return regexp_flags_from_string(s.view());
    } catch (const std::exception& e) {
        throw native_error_exception{native_error_type::syntax, global.stack_trace(), e.what()};
    }
}